

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_conn.cc
# Opt level: O3

void __thiscall flyd_connection_s::PutOneToFree(flyd_connection_s *this)

{
  CMemory *pCVar1;
  
  this->iCurrsequence = this->iCurrsequence + 1;
  if (this->precvMemPointer != (char *)0x0) {
    pCVar1 = CMemory::GetInstance();
    CMemory::FreeMemory(pCVar1,this->precvMemPointer);
    this->precvMemPointer = (char *)0x0;
  }
  if (this->psendMemPointer != (char *)0x0) {
    pCVar1 = CMemory::GetInstance();
    CMemory::FreeMemory(pCVar1,this->psendMemPointer);
    this->psendMemPointer = (char *)0x0;
  }
  LOCK();
  (this->iThrowsendCount).value_ = 0;
  UNLOCK();
  return;
}

Assistant:

void flyd_connection_s::PutOneToFree()
{
    ++iCurrsequence;   
    if(precvMemPointer != NULL)//我们曾经给这个连接分配过接收数据的内存，则要释放内存
    {        
        CMemory::GetInstance()->FreeMemory(precvMemPointer);
        precvMemPointer = NULL;        
    }
    if(psendMemPointer != NULL) //如果发送数据的缓冲区里有内容，则要释放内存
    {
        CMemory::GetInstance()->FreeMemory(psendMemPointer);
        psendMemPointer = NULL;
    }

    iThrowsendCount.getAndSet(0);                              //设置不设置感觉都行         
}